

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesMemoryGetState(zes_mem_handle_t hMemory,zes_mem_state_t *pState)

{
  zes_pfnMemoryGetState_t pfnGetState;
  ze_result_t result;
  zes_mem_state_t *pState_local;
  zes_mem_handle_t hMemory_local;
  
  pfnGetState._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cd00 != (code *)0x0) {
    pfnGetState._4_4_ = (*DAT_0011cd00)(hMemory,pState);
  }
  return pfnGetState._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesMemoryGetState(
        zes_mem_handle_t hMemory,                       ///< [in] Handle for the component.
        zes_mem_state_t* pState                         ///< [in,out] Will contain the current health and allocated memory.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetState = context.zesDdiTable.Memory.pfnGetState;
        if( nullptr != pfnGetState )
        {
            result = pfnGetState( hMemory, pState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }